

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

bool __thiscall nivalis::Shell::eval_line(Shell *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  size_t sVar6;
  long lVar7;
  ostream *poVar8;
  pointer pAVar9;
  uint64_t uVar10;
  uint uVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar12;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  undefined1 in_R8B;
  char cVar13;
  util *puVar14;
  ulong uVar15;
  bool bVar16;
  string_view expr_00;
  string_view expr_01;
  string_view expr_02;
  string_view expr_03;
  string parse_err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  def_fn_args;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bindings;
  string var;
  string str_to_parse;
  string cmd;
  Expr expr;
  double local_168;
  string local_160;
  uint32_t local_13c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_118;
  string local_f8;
  undefined4 local_d4;
  undefined8 local_d0;
  string local_c8;
  string local_a8;
  long local_88;
  Expr local_80;
  Expr local_68;
  uint64_t local_50;
  Expr local_48;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  util::trim(line);
  std::__cxx11::string::_M_assign((string *)&local_c8);
  iVar4 = std::__cxx11::string::compare((char *)line);
  if (iVar4 == 0) {
    this->closed = true;
    bVar16 = true;
    goto LAB_0010d083;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if ((line->_M_string_length != 0) && (*(line->_M_dataplus)._M_p == '%')) {
    anon_unknown.dwarf_484ce::get_word(&local_160,line);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,
                      CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                               local_160.field_2._M_local_buf[0]) + 1);
    }
  }
  util::trim(line);
  util::trim(&local_a8);
  iVar4 = std::__cxx11::string::compare((char *)&local_a8);
  if (iVar4 == 0) {
    bVar16 = Environment::del(this->env,line);
    poVar8 = this->os;
    if (bVar16) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"del ",4);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(line->_M_dataplus)._M_p,line->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      goto LAB_0010cbc6;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Undefined variable ",0x13);
LAB_0010cc0a:
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(line->_M_dataplus)._M_p,line->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
LAB_0010d05c:
    bVar16 = false;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_a8);
    if (iVar4 == 0) {
      bVar16 = Environment::del_func(this->env,line);
      poVar8 = this->os;
      if (!bVar16) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Undefined function ",0x13);
        goto LAB_0010cc0a;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"delf ",5);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(line->_M_dataplus)._M_p,line->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
LAB_0010cbc6:
      std::ostream::put((char)poVar8);
      bVar16 = true;
      std::ostream::flush();
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_a8);
      bVar16 = true;
      if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_a8), iVar4 != 0)) {
        iVar4 = std::__cxx11::string::compare((char *)&local_a8);
        bVar16 = iVar4 == 0;
      }
      if ((this->use_latex == false) &&
         (iVar4 = std::__cxx11::string::compare((char *)&local_a8), iVar4 != 0)) {
        local_d4 = 0;
      }
      else {
        uVar5 = std::__cxx11::string::compare((char *)&local_a8);
        local_d4 = (undefined4)CONCAT71((int7)((ulong)uVar5 >> 8),(int)uVar5 != 0);
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_a8);
      local_168 = (double)CONCAT44(local_168._4_4_,iVar4);
      if (bVar16 != false) {
        std::__cxx11::string::_M_assign((string *)&local_c8);
      }
      if (iVar4 == 0) {
        anon_unknown.dwarf_484ce::get_word(&local_160,line);
        util::trim(&local_160);
        util::trim(line);
        expr_00._M_str = extraout_RDX;
        expr_00._M_len = (size_t)local_160._M_dataplus._M_p;
        bVar3 = util::is_varname((util *)local_160._M_string_length,expr_00);
        if (bVar3) {
          local_50 = Environment::addr_of(this->env,&local_160,false);
          std::__cxx11::string::_M_assign((string *)&local_c8);
        }
        else {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (this->os,local_160._M_dataplus._M_p,local_160._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," is not a valid variable name\n",0x1e);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,
                          CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                   local_160.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar3) goto LAB_0010d05c;
      }
      bVar2 = *local_c8._M_dataplus._M_p;
      if (((((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) || (bVar2 == 0x5f)) || (bVar2 == 0x27)) &&
         (expr_01._M_str = (char *)0x0, expr_01._M_len = (size_t)local_c8._M_dataplus._M_p,
         sVar6 = util::find_equality((util *)local_c8._M_string_length,expr_01,true,(bool)in_R8B),
         sVar6 != 0xffffffffffffffff)) {
        std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_c8);
        std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,
                          CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                   local_160.field_2._M_local_buf[0]) + 1);
        }
        util::trim(&local_f8);
        local_13c = 0x18;
        uVar11 = (byte)(local_f8._M_dataplus._M_p + -1)[local_f8._M_string_length] - 0x25;
        pcVar12 = extraout_RDX_00;
        if ((uVar11 < 0x3a) &&
           (pcVar12 = (char *)0x200000000000561,
           (0x200000000000561U >> ((ulong)uVar11 & 0x3f) & 1) != 0)) {
          local_13c = OpCode::from_char((local_f8._M_dataplus._M_p + -1)[local_f8._M_string_length])
          ;
          std::__cxx11::string::pop_back();
          util::trim(&local_f8);
          pcVar12 = extraout_RDX_01;
        }
        if ((local_f8._M_dataplus._M_p + -1)[local_f8._M_string_length] != ')') {
          expr_03._M_str = pcVar12;
          expr_03._M_len = (size_t)local_f8._M_dataplus._M_p;
          bVar3 = util::is_varname((util *)local_f8._M_string_length,expr_03);
          if (bVar3) {
            std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_c8);
            std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,
                              CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                       local_160.field_2._M_local_buf[0]) + 1);
            }
          }
          goto LAB_0010cf14;
        }
        lVar7 = std::__cxx11::string::find((char)&local_f8,0x28);
        if (lVar7 == -1) goto LAB_0010cf14;
        puVar14 = (util *)(lVar7 + 1);
        local_d0 = CONCAT71((int7)((ulong)lVar7 >> 8),1);
        if (puVar14 < local_f8._M_string_length) {
          local_88 = lVar7;
          do {
            if ((local_f8._M_dataplus._M_p[(long)puVar14] == ',') ||
               (local_f8._M_dataplus._M_p[(long)puVar14] == ')')) {
              std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_f8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_138,&local_160);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                         local_160.field_2._M_local_buf[0]) + 1);
              }
              util::trim(local_138.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
              if (((local_f8._M_dataplus._M_p[(long)puVar14] == ')') &&
                  ((long)local_138.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_138.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start == 0x20)) &&
                 (local_138.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length == 0)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase_at_end(&local_138,
                                  local_138.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                break;
              }
              if (((util *)local_138.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length ==
                   (util *)0x0) ||
                 ((pcVar12 = local_138.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p,
                  *pcVar12 != '$' &&
                  (expr_02._M_str = extraout_RDX_02, expr_02._M_len = (size_t)pcVar12,
                  bVar3 = util::is_varname((util *)local_138.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  _M_string_length,expr_02), !bVar3)))) {
                poVar8 = this->os;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,local_138.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                                           _M_dataplus._M_p,
                                    local_138.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\': invalid argument variable name\n",0x22);
                local_d0 = 0;
                break;
              }
            }
            puVar14 = puVar14 + 1;
          } while (puVar14 < local_f8._M_string_length);
        }
        std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_f8);
        std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,
                          CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                   local_160.field_2._M_local_buf[0]) + 1);
        }
        util::rtrim(&local_f8);
        if ((char)local_d0 == '\0') {
          cVar13 = '\0';
        }
        else {
          std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_c8);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_160);
          cVar13 = (char)local_d0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,
                            CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                     local_160.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      else {
        local_13c = 0x18;
LAB_0010cf14:
        cVar13 = '\0';
      }
      if (local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar7 = 0;
        uVar15 = 0;
        do {
          Environment::addr_of
                    (this->env,
                     (string *)
                     ((long)&((local_138.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7
                     ),false);
          uVar15 = uVar15 + 1;
          lVar7 = lVar7 + 0x20;
        } while (uVar15 < (ulong)((long)local_138.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_138.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      paVar1 = &local_160.field_2;
      local_160._M_string_length = 0;
      local_160.field_2._M_local_buf[0] = '\0';
      local_160._M_dataplus._M_p = (pointer)paVar1;
      if ((char)local_d4 == '\0') {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,local_c8._M_dataplus._M_p,
                   (util *)(local_c8._M_string_length + (long)local_c8._M_dataplus._M_p));
      }
      else {
        nivalis::latex_to_nivalis(&local_118,&local_c8);
      }
      parse(&local_80,&local_118,this->env,(bool)(~bVar16 & iVar4 != 0),true,
            (long)local_138.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_138.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((util *)local_160._M_string_length != (util *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->os,local_160._M_dataplus._M_p,local_160._M_string_length);
LAB_0010d028:
        if (local_80.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.ast.
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.ast.
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != paVar1) {
          operator_delete(local_160._M_dataplus._M_p,
                          CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                   local_160.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0010d05c;
      }
      if (bVar16 == false) {
        if (iVar4 == 0) {
          Expr::diff((Expr *)&local_118,&local_80,local_50,this->env);
          poVar8 = Expr::repr((Expr *)&local_118,this->os,this->env);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
LAB_0010d363:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_118._M_dataplus._M_p,
                            local_118.field_2._M_allocated_capacity -
                            (long)local_118._M_dataplus._M_p);
          }
        }
        else if ((cVar13 != '\0') ||
                (local_168 = Expr::operator()(&local_80,this->env), !NAN(local_168))) {
          if (((util *)local_f8._M_string_length == (util *)0x0) ||
             ((util *)local_160._M_string_length != (util *)0x0)) {
            poVar8 = std::ostream::_M_insert<double>(local_168);
            std::endl<char,std::char_traits<char>>(poVar8);
          }
          else {
            if (cVar13 != '\0') {
              local_118._M_dataplus._M_p = (pointer)0x0;
              local_118._M_string_length = 0;
              local_118.field_2._M_allocated_capacity = 0;
              if (local_138.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_138.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                lVar7 = 0;
                uVar15 = 0;
                do {
                  pAVar9 = (pointer)0xffffffffffffffff;
                  if (**(char **)((long)&((local_138.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7) != '$') {
                    pAVar9 = (pointer)Environment::addr_of
                                                (this->env,
                                                 (string *)
                                                 ((long)&((local_138.
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar7),true);
                  }
                  local_68.ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start = pAVar9;
                  if (local_118._M_string_length == local_118.field_2._M_allocated_capacity) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    _M_realloc_insert<unsigned_long>
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_118,
                               (iterator)local_118._M_string_length,(unsigned_long *)&local_68);
                  }
                  else {
                    *(pointer *)local_118._M_string_length = pAVar9;
                    local_118._M_string_length = local_118._M_string_length + 8;
                  }
                  uVar15 = uVar15 + 1;
                  lVar7 = lVar7 + 0x20;
                } while (uVar15 < (ulong)((long)local_138.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_138.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
              uVar10 = Environment::def_func
                                 (this->env,&local_f8,&local_80,
                                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &local_118);
              if (uVar10 != 0xffffffffffffffff) {
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (this->os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
                if (local_138.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_138.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  uVar15 = 0;
                  do {
                    if (uVar15 != 0) {
                      std::__ostream_insert<char,std::char_traits<char>>(this->os,", ",2);
                    }
                    poVar8 = this->os;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"$",1);
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                    uVar15 = uVar15 + 1;
                  } while (uVar15 < (ulong)((long)local_138.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_138.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                }
                std::__ostream_insert<char,std::char_traits<char>>(this->os,") = ",4);
                poVar8 = Expr::repr(&(this->env->funcs).
                                     super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar10].expr,this->os
                                    ,this->env);
                std::endl<char,std::char_traits<char>>(poVar8);
              }
              goto LAB_0010d363;
            }
            if (local_13c != 0x18) {
              uVar10 = Environment::addr_of(this->env,&local_f8,true);
              if (uVar10 == 0xffffffffffffffff) {
                poVar8 = this->os;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"Undefined variable \"",0x14);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,local_f8._M_dataplus._M_p,local_f8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" (operator assignment)\n",0x18);
              }
              else {
                Expr::constant(&local_68,
                               (this->env->vars).super__Vector_base<double,_std::allocator<double>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar10]);
                Expr::constant(&local_48,local_168);
                Expr::combine((Expr *)&local_118,&local_68,local_13c,&local_48);
                local_168 = Expr::operator()((Expr *)&local_118,this->env);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity -
                                  (long)local_118._M_dataplus._M_p);
                }
                if (local_48.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.ast.
                                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_48.ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_48.ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_68.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_68.ast.
                                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_68.ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_68.ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              if (uVar10 == 0xffffffffffffffff) goto LAB_0010d028;
            }
            Environment::set(this->env,&local_f8,local_168);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (this->os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
            poVar8 = std::ostream::_M_insert<double>(local_168);
            std::endl<char,std::char_traits<char>>(poVar8);
          }
        }
      }
      else {
        Expr::optimize(&local_80,5);
        poVar8 = Expr::repr(&local_80,this->os,this->env);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      }
      if (local_80.ast.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.ast.
                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != paVar1) {
        operator_delete(local_160._M_dataplus._M_p,
                        CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                 local_160.field_2._M_local_buf[0]) + 1);
      }
      bVar16 = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
LAB_0010d083:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return bVar16;
}

Assistant:

bool Shell::eval_line(std::string line) {
    int assn_opcode = OpCode::bsel;
    std::string str_to_parse, var;
    std::vector<std::string> def_fn_args;
    bool def_fn;
    util::trim(line);
    str_to_parse = line;
    if (line == "exit") {
        // Exit shell, if applicable
        closed = true;
        return true;
    }

    std::string cmd;
    if (line.size() && line[0] == '%') {
        cmd = get_word(line);
    }
    util::trim(line);
    util::trim(cmd);
    if (cmd == "%del") {
        // Delete variable
        if (env.del(line)) {
            os << "del " << line << std::endl;
        } else {
            os << "Undefined variable " << line << "\n";
            return false;
        }
    } else if (cmd == "%delf") {
        // Delete function
        if (env.del_func(line)) {
            os << "delf " << line << std::endl;
        } else {
            os << "Undefined function " << line << "\n";
            return false;
        }
    } else {
        bool do_optim = cmd == "%" || cmd == "%tex" || cmd == "%niv";
        bool will_use_latex = (use_latex || cmd == "%tex") && cmd != "%niv";
        bool do_diff = cmd == "%diff";
        if (do_optim) str_to_parse = line;
        uint64_t diff_var_addr;
        if (do_diff) {
            std::string diff_var = get_word(line);
            util::trim(diff_var); util::trim(line);
            if (!util::is_varname(diff_var)) {
                os << diff_var << " is not a valid variable name\n";
                return false;
            }
            diff_var_addr = env.addr_of(diff_var, false);
            str_to_parse = line;
        }
        // Evaluate
        def_fn = false;
        assn_opcode = OpCode::bsel;
        if (util::is_varname_first(str_to_parse[0])) {
            size_t pos = util::find_equality(str_to_parse);
            if (~pos) {
                var = str_to_parse.substr(0, pos);
                util::trim(var);
                if (util::is_arith_operator(var.back())) {
                    assn_opcode = OpCode::from_char(var.back());
                    var.pop_back();
                    util::trim(var);
                }
                if (var.back() == ')') {
                    auto brpos = var.find('(');
                    if (brpos != std::string::npos) {
                        // Function def
                        def_fn = true;
                        size_t prev_comma = brpos + 1;
                        for (size_t i = brpos + 1; i < var.size(); ++i) {
                            if (var[i] == ',' || var[i] == ')') {
                                def_fn_args.push_back(var.substr(
                                            prev_comma, i - prev_comma));
                                util::trim(def_fn_args.back());
                                if (var[i] == ')' && def_fn_args.size() == 1 &&
                                    def_fn_args.back().empty()) {
                                    // Function with no arguments
                                    def_fn_args.clear();
                                    break;
                                }
                                if (def_fn_args.back().empty() ||
                                    (def_fn_args.back()[0] != '$' &&
                                    !util::is_varname(def_fn_args.back()))) {
                                    os << "'" << def_fn_args.back() <<
                                        "': invalid argument variable name\n";
                                    def_fn = false;
                                    break;
                                }
                                prev_comma = i + 1;
                            }
                        }
                        var = var.substr(0, brpos);
                        util::rtrim(var);
                        if (def_fn) str_to_parse = str_to_parse.substr(pos + 1);
                    }
                } else if (util::is_varname(var)) {
                    // Assignment
                    str_to_parse = str_to_parse.substr(pos + 1);
                }
            }
        }

        for (size_t i = 0; i < def_fn_args.size(); ++i) {
            // Pre-register variables
            env.addr_of(def_fn_args[i], false);
        }
        std::string parse_err;
        Expr expr = parse(will_use_latex ?  latex_to_nivalis(str_to_parse)
                : str_to_parse, env, !(do_diff || do_optim), // expicit
                true, // quiet
                def_fn_args.size(), // max args
                &parse_err);
        if (parse_err.size()) {
            os << parse_err;
            return false;
        }
        if (do_optim) {
            expr.optimize();
            expr.repr(os, env) << "\n";
        } else if (do_diff) {
            Expr diff = expr.diff(diff_var_addr, env);
            diff.repr(os, env) << "\n";
        } else {
            double output;
            if (def_fn || !std::isnan(output = expr(env))) {
                // Assignment statement
                if (var.size() && parse_err.empty()) {
                    if (def_fn) {
                        // Define function
                        std::vector<uint64_t> bindings;
                        for (size_t i = 0; i < def_fn_args.size(); ++i) {
                            bindings.push_back(
                                    def_fn_args[i][0] == '$' ? -1 :
                                    env.addr_of(def_fn_args[i]));
                        }
                        auto addr = env.def_func(var, expr, bindings);
                        if (~addr) {
                            os << var << "(";
                            for (size_t i = 0; i < def_fn_args.size(); ++i) {
                                if (i) os << ", ";
                                os << "$" << i;
                            }
                            os << ") = ";
                            env.funcs[addr].expr.repr(os, env) << std::endl;
                        }

                    } else {
                        // Define variable
                        double var_val;
                        if (assn_opcode != OpCode::bsel) {
                            // Operator assignment
                            auto addr = env.addr_of(var, true);
                            if (addr == -1) {
                                os << "Undefined variable \"" << var
                                    << "\" (operator assignment)\n";
                                return false;
                            }
                            var_val = Expr::constant(env.vars[addr])
                                .combine(assn_opcode,
                                        Expr::constant(output))(env);
                        } else {
                            // Usual assignment
                            var_val = output;
                        }
                        env.set(var, var_val);
                        os << var << " = " << var_val << std::endl;
                    }
                } else {
                    os << output << std::endl;
                }
            }
        }
    }
    return true;
}